

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

bool idx2::operator==(stref *Lhs,stref *Rhs)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  uVar1 = Lhs->Size;
  uVar2 = Rhs->Size;
  if (uVar1 == uVar2) {
    bVar5 = (int)uVar1 < 1;
    if (0 < (int)uVar1) {
      uVar3 = 0;
      if (0 < (int)uVar2) {
        uVar3 = (ulong)uVar2;
      }
      uVar4 = 1;
      do {
        if (uVar4 - uVar3 == 1) {
          __assert_fail("Idx < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/String.h"
                        ,0x9b,"char &idx2::stref::operator[](int) const");
        }
        if ((Lhs->field_0).Ptr[uVar4 - 1] != (Rhs->field_0).Ptr[uVar4 - 1]) {
          return bVar5;
        }
        bVar5 = uVar1 <= uVar4;
        bVar6 = uVar4 != uVar1;
        uVar4 = uVar4 + 1;
      } while (bVar6);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool
operator==(const stref& Lhs, const stref& Rhs)
{
  stref& LhsR = const_cast<stref&>(Lhs);
  stref& RhsR = const_cast<stref&>(Rhs);
  if (LhsR.Size != RhsR.Size)
    return false;
  for (int I = 0; I < LhsR.Size; ++I)
  {
    if (LhsR[I] != RhsR[I])
      return false;
  }
  return true;
}